

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O3

void __thiscall
spvtools::opt::DominatorTree::InitializeTree(DominatorTree *this,CFG *cfg,Function *f)

{
  pointer *pppDVar1;
  BasicBlock *bb;
  pointer ppVar2;
  DominatorTreeNode *pDVar3;
  __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  _Var4;
  iterator __position;
  DominatorTree *this_00;
  pointer ppVar5;
  BasicBlock *pBVar6;
  DominatorTreeNode *first;
  vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
  edges;
  DominatorTreeNode *local_58;
  pointer local_50;
  vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
  local_48;
  
  ClearTree(this);
  if ((f->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (f->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar6 = &cfg->pseudo_exit_block_;
    if (this->postdominator_ == false) {
      pBVar6 = &cfg->pseudo_entry_block_;
    }
    local_48.
    super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetDominatorEdges(this,f,pBVar6,&local_48);
    ppVar2 = local_48.
             super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_50 = local_48.
               super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    for (ppVar5 = local_48.
                  super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1)
    {
      pBVar6 = ppVar5->first;
      bb = ppVar5->second;
      local_58 = GetOrInsertNode(this,pBVar6);
      if (pBVar6 == bb) {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::DominatorTreeNode*const>>
                          ((this->roots_).
                           super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->roots_).
                           super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_58);
        __position._M_current =
             (this->roots_).
             super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (_Var4._M_current == __position._M_current) {
          this_00 = this;
          if (_Var4._M_current ==
              (this->roots_).
              super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001fba34;
          *__position._M_current = local_58;
          pppDVar1 = &(this->roots_).
                      super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppDVar1 = *pppDVar1 + 1;
        }
      }
      else {
        pDVar3 = GetOrInsertNode(this,bb);
        local_58->parent_ = pDVar3;
        __position._M_current =
             (pDVar3->children_).
             super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pDVar3->children_).
            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_00 = (DominatorTree *)&pDVar3->children_;
LAB_001fba34:
          std::
          vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>
          ::_M_realloc_insert<spvtools::opt::DominatorTreeNode*const&>
                    ((vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>
                      *)this_00,__position,&local_58);
        }
        else {
          *__position._M_current = local_58;
          pppDVar1 = &(pDVar3->children_).
                      super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppDVar1 = *pppDVar1 + 1;
        }
      }
    }
    ResetDFNumbering(this);
    if (local_50 != (pointer)0x0) {
      operator_delete(local_50,(long)local_48.
                                     super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)local_50);
    }
  }
  return;
}

Assistant:

void DominatorTree::InitializeTree(const CFG& cfg, const Function* f) {
  ClearTree();

  // Skip over empty functions.
  if (f->cbegin() == f->cend()) {
    return;
  }

  const BasicBlock* placeholder_start_node =
      postdominator_ ? cfg.pseudo_exit_block() : cfg.pseudo_entry_block();

  // Get the immediate dominator for each node.
  std::vector<std::pair<BasicBlock*, BasicBlock*>> edges;
  GetDominatorEdges(f, placeholder_start_node, &edges);

  // Transform the vector<pair> into the tree structure which we can use to
  // efficiently query dominance.
  for (auto edge : edges) {
    DominatorTreeNode* first = GetOrInsertNode(edge.first);

    if (edge.first == edge.second) {
      if (std::find(roots_.begin(), roots_.end(), first) == roots_.end())
        roots_.push_back(first);
      continue;
    }

    DominatorTreeNode* second = GetOrInsertNode(edge.second);

    first->parent_ = second;
    second->children_.push_back(first);
  }
  ResetDFNumbering();
}